

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

CustomLayerParams_ParametersEntry_DoNotUse *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::CustomLayerParams_ParametersEntry_DoNotUse>
          (Arena *arena)

{
  CustomLayerParams_ParametersEntry_DoNotUse *pCVar1;
  
  if (arena != (Arena *)0x0) {
    pCVar1 = DoCreateMessage<CoreML::Specification::CustomLayerParams_ParametersEntry_DoNotUse>
                       (arena);
    return pCVar1;
  }
  pCVar1 = (CustomLayerParams_ParametersEntry_DoNotUse *)operator_new(0x28);
  CoreML::Specification::CustomLayerParams_ParametersEntry_DoNotUse::
  CustomLayerParams_ParametersEntry_DoNotUse(pCVar1,(Arena *)0x0);
  return pCVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }